

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O1

void __thiscall
spvtools::opt::CopyPropagateArrays::UpdateUses
          (CopyPropagateArrays *this,Instruction *original_ptr_inst,Instruction *new_ptr_inst)

{
  Op OVar1;
  IRContext *pIVar2;
  Instruction *pIVar3;
  pointer pOVar4;
  DefUseManager *this_00;
  ConstantManager *pCVar5;
  bool bVar6;
  CommonDebugInfoInstructions CVar7;
  array<signed_char,_4UL> aVar8;
  array<signed_char,_4UL> aVar9;
  array<signed_char,_4UL> aVar10;
  array<signed_char,_4UL> aVar11;
  array<signed_char,_4UL> aVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  PodType PVar15;
  array<signed_char,_4UL> aVar16;
  array<signed_char,_4UL> aVar17;
  StorageClass storage_class;
  array<signed_char,_4UL> aVar18;
  array<signed_char,_4UL> aVar19;
  Instruction *pIVar20;
  Constant *this_01;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined8 *puVar24;
  uint uVar25;
  ConstantManager *this_02;
  uint uVar26;
  vector<unsigned_int,_std::allocator<unsigned_int>_> access_chain;
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  uses;
  _Any_data local_c8;
  PodType local_b8;
  PodType PStack_b4;
  code **ppcStack_b0;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  ConstantManager *local_78;
  DefUseManager *local_70;
  Instruction *local_68;
  Instruction *local_60;
  TypeManager *local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 *puStack_40;
  long local_38;
  
  pIVar2 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar2->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar2);
  }
  local_58 = (pIVar2->type_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  pIVar2 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar2->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(pIVar2);
  }
  this_02 = (pIVar2->constant_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  pIVar2 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar2);
  }
  local_70 = (pIVar2->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_c8._M_unused._M_object = &local_48;
  local_48 = (undefined8 *)0x0;
  puStack_40 = (undefined8 *)0x0;
  local_38 = 0;
  local_c8._8_8_ = 0;
  ppcStack_b0 = (code **)std::
                         _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp:645:27)>
                         ::_M_invoke;
  _local_b8 = std::
              _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp:645:27)>
              ::_M_manager;
  local_60 = original_ptr_inst;
  analysis::DefUseManager::ForEachUse
            (local_70,original_ptr_inst,
             (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_c8);
  if ((PodType  [2])_local_b8 != (PodType  [2])0x0) {
    (*_local_b8)(&local_c8,&local_c8,3);
  }
  local_50 = puStack_40;
  puVar24 = local_48;
  pCVar5 = this_02;
  pIVar3 = new_ptr_inst;
  if (local_48 != puStack_40) {
    do {
      local_68 = pIVar3;
      local_78 = pCVar5;
      pIVar3 = (Instruction *)*puVar24;
      uVar26 = *(uint *)(puVar24 + 1);
      uVar21 = (ulong)uVar26;
      CVar7 = Instruction::GetCommonDebugOpcode(pIVar3);
      if (CVar7 != CommonDebugInfoInstructionsMax) {
        CVar7 = Instruction::GetCommonDebugOpcode(pIVar3);
        if (CVar7 != CommonDebugInfoDebugValue) {
          if (CVar7 != CommonDebugInfoDebugDeclare) {
            __assert_fail("false && \"Don\'t know how to rewrite instruction\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                          ,0x2b3,
                          "void spvtools::opt::CopyPropagateArrays::UpdateUses(Instruction *, Instruction *)"
                         );
          }
          if ((new_ptr_inst->opcode_ != OpVariable) &&
             (new_ptr_inst->opcode_ != OpFunctionParameter)) {
            IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,pIVar3);
            uVar22 = (ulong)(uVar26 - 2);
            local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
            ppcStack_b0 = (code **)&local_b8;
            local_a8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_b8.data._M_elems = (array<signed_char,_4UL>)0x1d;
            local_c8._8_8_ = 1;
            pOVar4 = (pIVar3->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar23 = ((long)(pIVar3->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                     -0x5555555555555555;
            if (uVar23 < uVar22 || uVar23 - uVar22 == 0) goto LAB_0058f10a;
            uVar25 = (pIVar3->has_result_id_ & 1) + 1;
            if (pIVar3->has_type_id_ == false) {
              uVar25 = (uint)pIVar3->has_result_id_;
            }
            if (uVar26 - 2 < uVar25) goto LAB_0058f129;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      (&pOVar4[uVar22].words,(SmallVector<unsigned_int,_2UL> *)&local_c8);
            local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
            if (local_a8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
            {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_a8,local_a8._M_head_impl);
            }
            aVar10._M_elems[0] = '\0';
            aVar10._M_elems[1] = '\0';
            aVar10._M_elems[2] = '\0';
            aVar10._M_elems[3] = '\0';
            if (new_ptr_inst->has_result_id_ == true) {
              aVar10._M_elems =
                   (_Type)Instruction::GetSingleWordOperand
                                    (new_ptr_inst,(uint)new_ptr_inst->has_type_id_);
            }
            local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
            ppcStack_b0 = (code **)&local_b8;
            local_a8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_b8.data._M_elems =
                 (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar10._M_elems;
            local_c8._8_8_ = 1;
            pOVar4 = (pIVar3->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar22 = ((long)(pIVar3->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                     -0x5555555555555555;
            if (uVar22 < uVar21 || uVar22 - uVar21 == 0) goto LAB_0058f10a;
            uVar25 = (pIVar3->has_result_id_ & 1) + 1;
            if (pIVar3->has_type_id_ == false) {
              uVar25 = (uint)pIVar3->has_result_id_;
            }
            if (uVar26 < uVar25) goto LAB_0058f129;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      (&pOVar4[uVar21].words,(SmallVector<unsigned_int,_2UL> *)&local_c8);
            local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
            if (local_a8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
            {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_a8,local_a8._M_head_impl);
            }
            uVar26 = uVar26 + 1;
            uVar13 = Instruction::GetSingleWordOperand(pIVar3,uVar26);
            pIVar20 = analysis::DefUseManager::GetDef(local_70,uVar13);
            pIVar2 = (this->super_MemPass).super_Pass.context_;
            if ((pIVar2->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
              IRContext::BuildDebugInfoManager(pIVar2);
            }
            pIVar20 = analysis::DebugInfoManager::DerefDebugExpression
                                ((pIVar2->debug_info_mgr_)._M_t.
                                 super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                                 .
                                 super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>
                                 ._M_head_impl,pIVar20);
            aVar11._M_elems[0] = '\0';
            aVar11._M_elems[1] = '\0';
            aVar11._M_elems[2] = '\0';
            aVar11._M_elems[3] = '\0';
            if (pIVar20->has_result_id_ == true) {
              aVar11._M_elems =
                   (_Type)Instruction::GetSingleWordOperand(pIVar20,(uint)pIVar20->has_type_id_);
            }
            new_ptr_inst = local_68;
            local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
            ppcStack_b0 = (code **)&local_b8;
            local_a8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_b8.data._M_elems =
                 (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar11._M_elems;
            local_c8._8_8_ = 1;
            uVar21 = (ulong)uVar26;
            pOVar4 = (pIVar3->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar22 = ((long)(pIVar3->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                     -0x5555555555555555;
            if (uVar22 < uVar21 || uVar22 - uVar21 == 0) goto LAB_0058f10a;
            uVar25 = (pIVar3->has_result_id_ & 1) + 1;
            if (pIVar3->has_type_id_ == false) {
              uVar25 = (uint)pIVar3->has_result_id_;
            }
            if (uVar26 < uVar25) goto LAB_0058f129;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      (&pOVar4[uVar21].words,(SmallVector<unsigned_int,_2UL> *)&local_c8);
            local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
            if (local_a8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
            {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_a8,local_a8._M_head_impl);
            }
            IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,pIVar20);
            IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,pIVar3);
            this_02 = local_78;
            goto LAB_0058eef9;
          }
        }
        goto switchD_0058e4dc_caseD_3c;
      }
      OVar1 = pIVar3->opcode_;
      switch(OVar1) {
      case OpLoad:
        IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,pIVar3);
        aVar8._M_elems[0] = '\0';
        aVar8._M_elems[1] = '\0';
        aVar8._M_elems[2] = '\0';
        aVar8._M_elems[3] = '\0';
        if (new_ptr_inst->has_result_id_ == true) {
          aVar8._M_elems =
               (_Type)Instruction::GetSingleWordOperand
                                (new_ptr_inst,(uint)new_ptr_inst->has_type_id_);
        }
        local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
        ppcStack_b0 = (code **)&local_b8;
        local_a8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_b8.data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar8._M_elems;
        local_c8._8_8_ = 1;
        pOVar4 = (pIVar3->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar22 = ((long)(pIVar3->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                 -0x5555555555555555;
        if (uVar22 < uVar21 || uVar22 - uVar21 == 0) goto LAB_0058f10a;
        uVar25 = (pIVar3->has_result_id_ & 1) + 1;
        if (pIVar3->has_type_id_ == false) {
          uVar25 = (uint)pIVar3->has_result_id_;
        }
        if (uVar26 < uVar25) goto LAB_0058f129;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  (&pOVar4[uVar21].words,(SmallVector<unsigned_int,_2UL> *)&local_c8);
        local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
        if (local_a8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_a8,local_a8._M_head_impl);
        }
        aVar9._M_elems[0] = '\0';
        aVar9._M_elems[1] = '\0';
        aVar9._M_elems[2] = '\0';
        aVar9._M_elems[3] = '\0';
        uVar13 = 0;
        if (new_ptr_inst->has_type_id_ == true) {
          uVar13 = Instruction::GetSingleWordOperand(new_ptr_inst,0);
        }
        pIVar20 = analysis::DefUseManager::GetDef(local_70,uVar13);
        uVar26 = (pIVar20->has_result_id_ & 1) + 1;
        if (pIVar20->has_type_id_ == false) {
          uVar26 = (uint)pIVar20->has_result_id_;
        }
        PVar15.data._M_elems =
             (array<signed_char,_4UL>)Instruction::GetSingleWordOperand(pIVar20,uVar26 + 1);
        if (pIVar3->has_type_id_ == true) {
          aVar9._M_elems = (_Type)Instruction::GetSingleWordOperand(pIVar3,0);
        }
        if (PVar15.data._M_elems == (array<signed_char,_4UL>)aVar9._M_elems) {
          IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,pIVar3);
        }
        else {
          if (pIVar3->has_type_id_ == false) {
LAB_0058f186:
            __assert_fail("has_type_id_",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2de,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
          }
          if (PVar15.data._M_elems == (_Type)0x0) {
LAB_0058f167:
            __assert_fail("ty_id != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2e3,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
          }
          local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
          ppcStack_b0 = (code **)&local_b8;
          local_a8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_b8.data._M_elems = PVar15.data._M_elems;
          local_c8._8_8_ = 1;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    (&((pIVar3->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start)->words,
                     (SmallVector<unsigned_int,_2UL> *)&local_c8);
          local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
          if (local_a8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_a8,local_a8._M_head_impl);
          }
          IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,pIVar3);
          UpdateUses(this,pIVar3,pIVar3);
        }
        this_02 = local_78;
        AddUsesToWorklist(this,pIVar3);
        break;
      case OpStore:
        if (uVar26 != 1) break;
        uVar13 = (pIVar3->has_result_id_ & 1) + 1;
        if (pIVar3->has_type_id_ == false) {
          uVar13 = (uint)pIVar3->has_result_id_;
        }
        uVar13 = Instruction::GetSingleWordOperand(pIVar3,uVar13);
        pIVar20 = analysis::DefUseManager::GetDef(local_70,uVar13);
        uVar13 = 0;
        if (pIVar20->has_type_id_ == true) {
          uVar13 = Instruction::GetSingleWordOperand(pIVar20,0);
        }
        pIVar20 = analysis::DefUseManager::GetDef(local_70,uVar13);
        uVar26 = (pIVar20->has_result_id_ & 1) + 1;
        if (pIVar20->has_type_id_ == false) {
          uVar26 = (uint)pIVar20->has_result_id_;
        }
        uVar13 = Instruction::GetSingleWordOperand(pIVar20,uVar26 + 1);
        PVar15.data._M_elems =
             (array<signed_char,_4UL>)Pass::GenerateCopy((Pass *)this,local_60,uVar13,pIVar3);
        if (PVar15.data._M_elems == (_Type)0x0) {
          __assert_fail("copy != 0 && \"Should not be updating uses unless we know it can be done.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                        ,0x329,
                        "void spvtools::opt::CopyPropagateArrays::UpdateUses(Instruction *, Instruction *)"
                       );
        }
        IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,pIVar3);
        local_b8.data._M_elems = PVar15.data._M_elems;
        uVar21 = (ulong)(pIVar3->has_result_id_ & 1) + 1;
        if (pIVar3->has_type_id_ == false) {
          uVar21 = (ulong)pIVar3->has_result_id_;
        }
        uVar21 = uVar21 + 1;
        pOVar4 = (pIVar3->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar22 = ((long)(pIVar3->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                 -0x5555555555555555;
        if (uVar22 < uVar21 || uVar22 - uVar21 == 0) goto LAB_0058f10a;
        pOVar4 = (pointer)((long)((pOVar4->words).buffer + 0xfffffffffffffffa) +
                          (ulong)(uint)((int)uVar21 * 0x30));
        goto LAB_0058eec6;
      case OpCopyMemory:
      case OpCopyMemorySized:
      case OpInBoundsAccessChain:
      case OpPtrAccessChain:
      case OpArrayLength:
      case OpGenericPtrMemSemantics:
      case OpInBoundsPtrAccessChain:
switchD_0058e4dc_caseD_3f:
        __assert_fail("false && \"Don\'t know how to rewrite instruction\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                      ,0x33b,
                      "void spvtools::opt::CopyPropagateArrays::UpdateUses(Instruction *, Instruction *)"
                     );
      case OpAccessChain:
        IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,pIVar3);
        aVar17._M_elems[0] = '\0';
        aVar17._M_elems[1] = '\0';
        aVar17._M_elems[2] = '\0';
        aVar17._M_elems[3] = '\0';
        if (new_ptr_inst->has_result_id_ == true) {
          aVar17._M_elems =
               (_Type)Instruction::GetSingleWordOperand
                                (new_ptr_inst,(uint)new_ptr_inst->has_type_id_);
        }
        local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
        ppcStack_b0 = (code **)&local_b8;
        local_a8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_b8.data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar17._M_elems;
        local_c8._8_8_ = 1;
        pOVar4 = (pIVar3->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar22 = ((long)(pIVar3->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                 -0x5555555555555555;
        if (uVar22 < uVar21 || uVar22 - uVar21 == 0) goto LAB_0058f10a;
        uVar25 = (pIVar3->has_result_id_ & 1) + 1;
        if (pIVar3->has_type_id_ == false) {
          uVar25 = (uint)pIVar3->has_result_id_;
        }
        if (uVar26 < uVar25) goto LAB_0058f129;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  (&pOVar4[uVar21].words,(SmallVector<unsigned_int,_2UL> *)&local_c8);
        local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
        if (local_a8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_a8,local_a8._M_head_impl);
        }
        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint32_t *)0x0;
        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (uint32_t *)0x0;
        uVar26 = (pIVar3->has_result_id_ & 1) + 1;
        if (pIVar3->has_type_id_ == false) {
          uVar26 = (uint)pIVar3->has_result_id_;
        }
        if (1 < (int)((ulong)((long)(pIVar3->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pIVar3->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
                uVar26) {
          uVar25 = 1;
          do {
            uVar13 = Instruction::GetSingleWordOperand(pIVar3,uVar26 + uVar25);
            this_01 = analysis::ConstantManager::FindDeclaredConstant(this_02,uVar13);
            if (this_01 == (Constant *)0x0) {
              local_c8._M_unused._M_member_pointer =
                   local_c8._M_unused._M_member_pointer & 0xffffffff00000000;
              if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = 0;
                goto LAB_0058ebe9;
              }
LAB_0058ebf4:
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_98,
                         (iterator)
                         local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)local_c8._M_pod_data);
            }
            else {
              uVar13 = analysis::Constant::GetU32(this_01);
              local_c8._0_4_ = uVar13;
              if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_0058ebf4;
              *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = uVar13;
LAB_0058ebe9:
              local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            uVar25 = uVar25 + 1;
            uVar26 = (pIVar3->has_result_id_ & 1) + 1;
            if (pIVar3->has_type_id_ == false) {
              uVar26 = (uint)pIVar3->has_result_id_;
            }
          } while (uVar25 < (int)((ulong)((long)(pIVar3->operands_).
                                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(pIVar3->operands_).
                                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                            -0x55555555 - uVar26);
        }
        pIVar2 = (this->super_MemPass).super_Pass.context_;
        if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar2);
        }
        this_00 = (pIVar2->def_use_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                  _M_head_impl;
        aVar18._M_elems[0] = '\0';
        aVar18._M_elems[1] = '\0';
        aVar18._M_elems[2] = '\0';
        aVar18._M_elems[3] = '\0';
        uVar13 = 0;
        if (new_ptr_inst->has_type_id_ == true) {
          uVar13 = Instruction::GetSingleWordOperand(new_ptr_inst,0);
        }
        pIVar20 = analysis::DefUseManager::GetDef(this_00,uVar13);
        uVar26 = (pIVar20->has_result_id_ & 1) + 1;
        if (pIVar20->has_type_id_ == false) {
          uVar26 = (uint)pIVar20->has_result_id_;
        }
        uVar13 = Instruction::GetSingleWordOperand(pIVar20,uVar26 + 1);
        uVar14 = GetMemberTypeId(this,uVar13,&local_98);
        uVar13 = (pIVar20->has_result_id_ & 1) + 1;
        if (pIVar20->has_type_id_ == false) {
          uVar13 = (uint)pIVar20->has_result_id_;
        }
        storage_class = Instruction::GetSingleWordOperand(pIVar20,uVar13);
        PVar15.data._M_elems =
             (array<signed_char,_4UL>)
             analysis::TypeManager::FindPointerToType(local_58,uVar14,storage_class);
        if (pIVar3->has_type_id_ == true) {
          aVar18._M_elems = (_Type)Instruction::GetSingleWordOperand(pIVar3,0);
        }
        new_ptr_inst = local_68;
        if (PVar15.data._M_elems == (array<signed_char,_4UL>)aVar18._M_elems) {
          IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,pIVar3);
          this_02 = local_78;
          new_ptr_inst = local_68;
        }
        else {
          if (pIVar3->has_type_id_ == false) goto LAB_0058f186;
          if (PVar15.data._M_elems == (_Type)0x0) goto LAB_0058f167;
          local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
          ppcStack_b0 = (code **)&local_b8;
          local_a8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_b8.data._M_elems = PVar15.data._M_elems;
          local_c8._8_8_ = 1;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    (&((pIVar3->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start)->words,
                     (SmallVector<unsigned_int,_2UL> *)&local_c8);
          local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
          if (local_a8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_a8,local_a8._M_head_impl);
          }
          IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,pIVar3);
          UpdateUses(this,pIVar3,pIVar3);
          this_02 = local_78;
        }
LAB_0058f0bb:
        if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_98.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        break;
      default:
        if (OVar1 != OpExtInst) {
          if (OVar1 != OpCompositeExtract) goto switchD_0058e4dc_caseD_3f;
          IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,pIVar3);
          aVar12._M_elems[0] = '\0';
          aVar12._M_elems[1] = '\0';
          aVar12._M_elems[2] = '\0';
          aVar12._M_elems[3] = '\0';
          if (new_ptr_inst->has_result_id_ == true) {
            aVar12._M_elems =
                 (_Type)Instruction::GetSingleWordOperand
                                  (new_ptr_inst,(uint)new_ptr_inst->has_type_id_);
          }
          local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
          ppcStack_b0 = (code **)&local_b8;
          local_a8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_b8.data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar12._M_elems
          ;
          local_c8._8_8_ = 1;
          pOVar4 = (pIVar3->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar22 = ((long)(pIVar3->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                   -0x5555555555555555;
          if (uVar22 < uVar21 || uVar22 - uVar21 == 0) goto LAB_0058f10a;
          uVar25 = (pIVar3->has_result_id_ & 1) + 1;
          if (pIVar3->has_type_id_ == false) {
            uVar25 = (uint)pIVar3->has_result_id_;
          }
          if (uVar26 < uVar25) goto LAB_0058f129;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    (&pOVar4[uVar21].words,(SmallVector<unsigned_int,_2UL> *)&local_c8);
          local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
          if (local_a8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_a8,local_a8._M_head_impl);
          }
          uVar13 = 0;
          if (new_ptr_inst->has_type_id_ == true) {
            uVar13 = Instruction::GetSingleWordOperand(new_ptr_inst,0);
          }
          local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (uint32_t *)0x0;
          local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (uint32_t *)0x0;
          uVar26 = (pIVar3->has_result_id_ & 1) + 1;
          if (pIVar3->has_type_id_ == false) {
            uVar26 = (uint)pIVar3->has_result_id_;
          }
          if (1 < (int)((ulong)((long)(pIVar3->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pIVar3->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555
                  - uVar26) {
            uVar25 = 1;
            do {
              uVar14 = Instruction::GetSingleWordOperand(pIVar3,uVar26 + uVar25);
              local_c8._0_4_ = uVar14;
              if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          (&local_98,
                           (iterator)
                           local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(uint *)local_c8._M_pod_data);
              }
              else {
                *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = uVar14;
                local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              uVar25 = uVar25 + 1;
              uVar26 = (pIVar3->has_result_id_ & 1) + 1;
              if (pIVar3->has_type_id_ == false) {
                uVar26 = (uint)pIVar3->has_result_id_;
              }
            } while (uVar25 < (int)((ulong)((long)(pIVar3->operands_).
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(pIVar3->operands_).
                                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                              -0x55555555 - uVar26);
          }
          PVar15.data._M_elems = (array<signed_char,_4UL>)GetMemberTypeId(this,uVar13,&local_98);
          aVar16._M_elems[0] = '\0';
          aVar16._M_elems[1] = '\0';
          aVar16._M_elems[2] = '\0';
          aVar16._M_elems[3] = '\0';
          if (pIVar3->has_type_id_ == true) {
            aVar16._M_elems = (_Type)Instruction::GetSingleWordOperand(pIVar3,0);
          }
          this_02 = local_78;
          if (PVar15.data._M_elems == (array<signed_char,_4UL>)aVar16._M_elems) {
            IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,pIVar3);
          }
          else {
            if (pIVar3->has_type_id_ == false) goto LAB_0058f186;
            if (PVar15.data._M_elems == (_Type)0x0) goto LAB_0058f167;
            local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
            ppcStack_b0 = (code **)&local_b8;
            local_a8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_b8.data._M_elems = PVar15.data._M_elems;
            local_c8._8_8_ = 1;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      (&((pIVar3->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start)->words,
                       (SmallVector<unsigned_int,_2UL> *)&local_c8);
            local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
            if (local_a8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
            {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_a8,local_a8._M_head_impl);
            }
            IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,pIVar3);
            UpdateUses(this,pIVar3,pIVar3);
          }
          goto LAB_0058f0bb;
        }
        bVar6 = IsInterpolationInstruction(this,pIVar3);
        if (!bVar6) {
          __assert_fail("false && \"Don\'t know how to rewrite instruction\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                        ,0x2d5,
                        "void spvtools::opt::CopyPropagateArrays::UpdateUses(Instruction *, Instruction *)"
                       );
        }
      case OpImageTexelPointer:
      case OpDecorate:
switchD_0058e4dc_caseD_3c:
        IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,pIVar3);
        aVar19._M_elems[0] = '\0';
        aVar19._M_elems[1] = '\0';
        aVar19._M_elems[2] = '\0';
        aVar19._M_elems[3] = '\0';
        if (new_ptr_inst->has_result_id_ == true) {
          aVar19._M_elems =
               (_Type)Instruction::GetSingleWordOperand
                                (new_ptr_inst,(uint)new_ptr_inst->has_type_id_);
        }
        local_b8.data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar19._M_elems;
        pOVar4 = (pIVar3->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar22 = ((long)(pIVar3->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
                 -0x5555555555555555;
        if (uVar22 < uVar21 || uVar22 - uVar21 == 0) {
LAB_0058f10a:
          ppcStack_b0 = (code **)&local_b8;
          local_a8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_c8._8_8_ = 1;
          local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
          __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2b8,
                        "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                       );
        }
        uVar25 = (pIVar3->has_result_id_ & 1) + 1;
        if (pIVar3->has_type_id_ == false) {
          uVar25 = (uint)pIVar3->has_result_id_;
        }
        if (uVar26 < uVar25) {
LAB_0058f129:
          ppcStack_b0 = (code **)&local_b8;
          local_a8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_c8._8_8_ = 1;
          local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
          __assert_fail("index >= TypeResultIdCount() && \"operand is not a in-operand\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2b9,
                        "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                       );
        }
        pOVar4 = pOVar4 + uVar21;
LAB_0058eec6:
        ppcStack_b0 = (code **)&local_b8;
        local_a8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_c8._8_8_ = 1;
        local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  (&pOVar4->words,(SmallVector<unsigned_int,_2UL> *)&local_c8);
        local_c8._M_unused._M_object = &PTR__SmallVector_009488e0;
        if (local_a8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_a8,local_a8._M_head_impl);
        }
        IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,pIVar3);
      }
LAB_0058eef9:
      puVar24 = puVar24 + 2;
      pCVar5 = local_78;
      pIVar3 = local_68;
    } while (puVar24 != local_50);
  }
  if (local_48 != (undefined8 *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  return;
}

Assistant:

void CopyPropagateArrays::UpdateUses(Instruction* original_ptr_inst,
                                     Instruction* new_ptr_inst) {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();

  std::vector<std::pair<Instruction*, uint32_t> > uses;
  def_use_mgr->ForEachUse(original_ptr_inst,
                          [&uses](Instruction* use, uint32_t index) {
                            uses.push_back({use, index});
                          });

  for (auto pair : uses) {
    Instruction* use = pair.first;
    uint32_t index = pair.second;

    if (use->IsCommonDebugInstr()) {
      switch (use->GetCommonDebugOpcode()) {
        case CommonDebugInfoDebugDeclare: {
          if (new_ptr_inst->opcode() == spv::Op::OpVariable ||
              new_ptr_inst->opcode() == spv::Op::OpFunctionParameter) {
            context()->ForgetUses(use);
            use->SetOperand(index, {new_ptr_inst->result_id()});
            context()->AnalyzeUses(use);
          } else {
            // Based on the spec, we cannot use a pointer other than OpVariable
            // or OpFunctionParameter for DebugDeclare. We have to use
            // DebugValue with Deref.

            context()->ForgetUses(use);

            // Change DebugDeclare to DebugValue.
            use->SetOperand(index - 2,
                            {static_cast<uint32_t>(CommonDebugInfoDebugValue)});
            use->SetOperand(index, {new_ptr_inst->result_id()});

            // Add Deref operation.
            Instruction* dbg_expr =
                def_use_mgr->GetDef(use->GetSingleWordOperand(index + 1));
            auto* deref_expr_instr =
                context()->get_debug_info_mgr()->DerefDebugExpression(dbg_expr);
            use->SetOperand(index + 1, {deref_expr_instr->result_id()});

            context()->AnalyzeUses(deref_expr_instr);
            context()->AnalyzeUses(use);
          }
          break;
        }
        case CommonDebugInfoDebugValue:
          context()->ForgetUses(use);
          use->SetOperand(index, {new_ptr_inst->result_id()});
          context()->AnalyzeUses(use);
          break;
        default:
          assert(false && "Don't know how to rewrite instruction");
          break;
      }
      continue;
    }

    switch (use->opcode()) {
      case spv::Op::OpLoad: {
        // Replace the actual use.
        context()->ForgetUses(use);
        use->SetOperand(index, {new_ptr_inst->result_id()});

        // Update the type.
        Instruction* pointer_type_inst =
            def_use_mgr->GetDef(new_ptr_inst->type_id());
        uint32_t new_type_id =
            pointer_type_inst->GetSingleWordInOperand(kTypePointerPointeeInIdx);
        if (new_type_id != use->type_id()) {
          use->SetResultType(new_type_id);
          context()->AnalyzeUses(use);
          UpdateUses(use, use);
        } else {
          context()->AnalyzeUses(use);
        }

        AddUsesToWorklist(use);
      } break;
      case spv::Op::OpExtInst: {
        if (IsInterpolationInstruction(use)) {
          // Replace the actual use.
          context()->ForgetUses(use);
          use->SetOperand(index, {new_ptr_inst->result_id()});
          context()->AnalyzeUses(use);
        } else {
          assert(false && "Don't know how to rewrite instruction");
        }
      } break;
      case spv::Op::OpAccessChain: {
        // Update the actual use.
        context()->ForgetUses(use);
        use->SetOperand(index, {new_ptr_inst->result_id()});

        // Convert the ids on the OpAccessChain to indices that can be used to
        // get the specific member.
        std::vector<uint32_t> access_chain;
        for (uint32_t i = 1; i < use->NumInOperands(); ++i) {
          const analysis::Constant* index_const =
              const_mgr->FindDeclaredConstant(use->GetSingleWordInOperand(i));
          if (index_const) {
            access_chain.push_back(index_const->GetU32());
          } else {
            // Variable index means the type is an type where every element
            // is the same type.  Use element 0 to get the type.
            access_chain.push_back(0);
          }
        }

        Instruction* pointer_type_inst =
            get_def_use_mgr()->GetDef(new_ptr_inst->type_id());

        uint32_t new_pointee_type_id = GetMemberTypeId(
            pointer_type_inst->GetSingleWordInOperand(kTypePointerPointeeInIdx),
            access_chain);

        spv::StorageClass storage_class = static_cast<spv::StorageClass>(
            pointer_type_inst->GetSingleWordInOperand(
                kTypePointerStorageClassInIdx));

        uint32_t new_pointer_type_id =
            type_mgr->FindPointerToType(new_pointee_type_id, storage_class);

        if (new_pointer_type_id != use->type_id()) {
          use->SetResultType(new_pointer_type_id);
          context()->AnalyzeUses(use);
          UpdateUses(use, use);
        } else {
          context()->AnalyzeUses(use);
        }
      } break;
      case spv::Op::OpCompositeExtract: {
        // Update the actual use.
        context()->ForgetUses(use);
        use->SetOperand(index, {new_ptr_inst->result_id()});

        uint32_t new_type_id = new_ptr_inst->type_id();
        std::vector<uint32_t> access_chain;
        for (uint32_t i = 1; i < use->NumInOperands(); ++i) {
          access_chain.push_back(use->GetSingleWordInOperand(i));
        }

        new_type_id = GetMemberTypeId(new_type_id, access_chain);

        if (new_type_id != use->type_id()) {
          use->SetResultType(new_type_id);
          context()->AnalyzeUses(use);
          UpdateUses(use, use);
        } else {
          context()->AnalyzeUses(use);
        }
      } break;
      case spv::Op::OpStore:
        // If the use is the pointer, then it is the single store to that
        // variable.  We do not want to replace it.  Instead, it will become
        // dead after all of the loads are removed, and ADCE will get rid of it.
        //
        // If the use is the object being stored, we will create a copy of the
        // object turning it into the correct type. The copy is done by
        // decomposing the object into the base type, which must be the same,
        // and then rebuilding them.
        if (index == 1) {
          Instruction* target_pointer = def_use_mgr->GetDef(
              use->GetSingleWordInOperand(kStorePointerInOperand));
          Instruction* pointer_type =
              def_use_mgr->GetDef(target_pointer->type_id());
          uint32_t pointee_type_id =
              pointer_type->GetSingleWordInOperand(kTypePointerPointeeInIdx);
          uint32_t copy = GenerateCopy(original_ptr_inst, pointee_type_id, use);
          assert(copy != 0 &&
                 "Should not be updating uses unless we know it can be done.");

          context()->ForgetUses(use);
          use->SetInOperand(index, {copy});
          context()->AnalyzeUses(use);
        }
        break;
      case spv::Op::OpDecorate:
      // We treat an OpImageTexelPointer as a load.  The result type should
      // always have the Image storage class, and should not need to be
      // updated.
      case spv::Op::OpImageTexelPointer:
        // Replace the actual use.
        context()->ForgetUses(use);
        use->SetOperand(index, {new_ptr_inst->result_id()});
        context()->AnalyzeUses(use);
        break;
      default:
        assert(false && "Don't know how to rewrite instruction");
        break;
    }
  }
}